

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_btGetAllMatches_noDict_3
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  uint uVar1;
  uint uVar2;
  U32 *pUVar3;
  U32 UVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  U32 UVar15;
  uint uVar16;
  uint uVar17;
  U32 UVar18;
  ulong uVar19;
  BYTE *pBVar20;
  uint uVar21;
  ulong uStack_f0;
  size_t local_e0;
  uint *local_c8;
  uint *local_b8;
  uint local_a0;
  uint local_9c;
  uint local_5c;
  BYTE *local_58;
  U32 *local_50;
  ulong local_48;
  BYTE *local_40;
  U32 *local_38;
  
  if (3 < (ms->cParams).minMatch) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8263,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar20 = (ms->window).base;
  uVar19 = (ulong)ms->nextToUpdate;
  if (ip < pBVar20 + uVar19) {
    return 0;
  }
  local_50 = nextToUpdate3;
  while( true ) {
    uVar21 = (uint)uVar19;
    uVar5 = (uint)((long)ip - (long)pBVar20);
    if (uVar5 <= uVar21) break;
    UVar4 = ZSTD_insertBt1(ms,pBVar20 + uVar19,iHighLimit,uVar5,3,0);
    uVar19 = (ulong)(UVar4 + uVar21);
    if (UVar4 + uVar21 <= uVar21) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815a,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if ((ulong)((long)ip - (long)pBVar20) >> 0x20 != 0) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815d,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((ulong)((long)iHighLimit - (long)pBVar20) >> 0x20 != 0) {
    __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815e,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar5;
  uVar5 = (ms->cParams).targetLength;
  uVar21 = 0xfff;
  if (uVar5 < 0xfff) {
    uVar21 = uVar5;
  }
  uVar5 = (ms->cParams).hashLog;
  if (0x20 < uVar5) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  local_48 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar5 & 0x1fU));
  local_58 = (ms->window).base;
  uVar16 = (int)ip - (int)local_58;
  uVar17 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uStack_f0 = 0;
  uVar5 = uVar16 - uVar17;
  if (uVar16 < uVar17) {
    uVar5 = 0;
  }
  UVar4 = (ms->window).lowLimit;
  UVar15 = 1;
  uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar18 = uVar16 - uVar14;
  if (uVar16 - UVar4 <= uVar14) {
    UVar18 = UVar4;
  }
  if (ms->loadedDictEnd != 0) {
    UVar18 = UVar4;
  }
  uVar6 = UVar18 + (UVar18 == 0);
  uVar14 = (ms->cParams).searchLog;
  if (1 < ll0) {
    __assert_fail("ll0 <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x819e,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  pUVar3 = ms->hashTable;
  uVar1 = pUVar3[local_48];
  local_38 = ms->chainTable;
  uVar2 = (ms->window).dictLimit;
  uVar19 = (ulong)((uVar17 & uVar16) * 2);
  local_b8 = local_38 + uVar19;
  local_c8 = local_38 + uVar19 + 1;
  local_a0 = uVar16 + 9;
  local_e0 = (size_t)(lengthToBeat - 1);
  local_40 = ip + 3;
  for (uVar19 = (ulong)ll0; ll0 + 3 != uVar19; uVar19 = uVar19 + 1) {
    if (uVar19 == 3) {
      uVar12 = *rep - 1;
    }
    else {
      uVar12 = rep[uVar19];
    }
    if (uVar16 < uVar2) {
      __assert_fail("curr >= dictLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81a5,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (uVar12 - 1 < uVar16 - uVar2) {
      uVar7 = 0;
      if ((UVar18 <= uVar16 - uVar12) &&
         (uVar7 = 0, ((*(uint *)(ip + -(ulong)uVar12) ^ *(uint *)ip) & 0xffffff) == 0)) {
        sVar9 = ZSTD_count(local_40,local_40 + -(ulong)uVar12,iHighLimit);
        uVar7 = (int)sVar9 + 3;
      }
    }
    else {
      uVar7 = 0;
      if (uVar16 < UVar18) {
        __assert_fail("curr >= windowLow",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81b1,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
    }
    uVar13 = (ulong)uVar7;
    if (local_e0 < uVar13) {
      matches[uStack_f0].off = UVar15;
      matches[uStack_f0].len = uVar7;
      uVar12 = (int)uStack_f0 + 1;
      uStack_f0 = (ulong)uVar12;
      if (uVar21 < uVar7) {
        return uVar12;
      }
      local_e0 = uVar13;
      if (ip + uVar13 == iHighLimit) {
        return uVar12;
      }
    }
    UVar15 = UVar15 + 1;
  }
  if ((((local_e0 < 3) &&
       (UVar4 = ZSTD_insertAndFindFirstIndexHash3(ms,local_50,ip), uVar6 <= UVar4)) &&
      (uVar16 - UVar4 < 0x40000)) && (sVar9 = ZSTD_count(ip,local_58 + UVar4,iHighLimit), 2 < sVar9)
     ) {
    if (uVar16 <= UVar4) {
      __assert_fail("curr > matchIndex3",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81de,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if ((int)uStack_f0 != 0) {
      __assert_fail("mnum==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81df,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    matches->off = (uVar16 - UVar4) + 3;
    matches->len = (U32)sVar9;
    if (uVar21 < sVar9 || ip + sVar9 == iHighLimit) {
      UVar15 = uVar16 + 1;
      UVar4 = 1;
      goto LAB_001d4d42;
    }
    uStack_f0 = 1;
    local_e0 = sVar9;
  }
  pUVar3[local_48] = uVar16;
  uVar19 = 0;
  uVar13 = 0;
  local_9c = 1 << ((byte)uVar14 & 0x1f);
LAB_001d4b8a:
  UVar4 = (U32)uStack_f0;
  if ((local_9c == 0) || (uVar1 < uVar6)) goto LAB_001d4d17;
  uVar10 = uVar19;
  if (uVar13 < uVar19) {
    uVar10 = uVar13;
  }
  if (uVar16 <= uVar1) {
    __assert_fail("curr > matchIndex",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x81f1,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  if (uVar10 + uVar1 < (ulong)uVar2) {
    __assert_fail("matchIndex+matchLength >= dictLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x81f4,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  pBVar20 = local_58 + uVar1;
  if ((uVar2 <= uVar1) && (iVar8 = bcmp(pBVar20,ip,uVar10), iVar8 != 0)) {
    __assert_fail("memcmp(match, ip, matchLength) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x81f6,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  sVar9 = ZSTD_count(ip + uVar10,pBVar20 + uVar10,iHighLimit);
  uVar10 = sVar9 + uVar10;
  if (local_e0 < uVar10) {
    if (local_a0 < uVar1 || local_a0 - uVar1 == 0) {
      __assert_fail("matchEndIdx > matchIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8203,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (local_a0 - uVar1 < uVar10) {
      local_a0 = uVar1 + (U32)uVar10;
    }
    matches[uStack_f0].off = (uVar16 + 3) - uVar1;
    matches[uStack_f0].len = (U32)uVar10;
    UVar4 = UVar4 + 1;
    uStack_f0 = (ulong)UVar4;
    if ((0x1000 < uVar10) || (local_e0 = uVar10, ip + uVar10 == iHighLimit)) goto LAB_001d4d17;
  }
  UVar4 = (U32)uStack_f0;
  puVar11 = local_38 + (uVar1 & uVar17) * 2;
  if (pBVar20[uVar10] < ip[uVar10]) {
    *local_b8 = uVar1;
    if (uVar1 <= uVar5) {
      local_b8 = &local_5c;
LAB_001d4d17:
      *local_c8 = 0;
      *local_b8 = 0;
      if (0x40000000 < local_9c) {
        __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8221,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (local_a0 <= uVar16 + 8) {
        __assert_fail("matchEndIdx > curr+8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8248,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      UVar15 = local_a0 - 8;
LAB_001d4d42:
      ms->nextToUpdate = UVar15;
      return UVar4;
    }
    puVar11 = puVar11 + 1;
    uVar13 = uVar10;
    local_b8 = puVar11;
  }
  else {
    *local_c8 = uVar1;
    local_c8 = puVar11;
    uVar19 = uVar10;
    if (uVar1 <= uVar5) {
      local_c8 = &local_5c;
      goto LAB_001d4d17;
    }
  }
  uVar1 = *puVar11;
  local_9c = local_9c - 1;
  goto LAB_001d4b8a;
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}